

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::NullaryScatter<long,duckdb::CountStarFunction>
               (Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  idx_t iVar3;
  idx_t iVar4;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_60;
  
  if (states->vector_type == FLAT_VECTOR) {
    if (count != 0) {
      pdVar1 = states->data;
      iVar3 = 0;
      do {
        **(long **)(pdVar1 + iVar3 * 8) = **(long **)(pdVar1 + iVar3 * 8) + 1;
        iVar3 = iVar3 + 1;
      } while (count != iVar3);
    }
  }
  else if (states->vector_type == CONSTANT_VECTOR) {
    **(long **)states->data = **(long **)states->data + count;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_60);
    Vector::ToUnifiedFormat(states,count,&local_60);
    if (count != 0) {
      psVar2 = (local_60.sel)->sel_vector;
      iVar3 = 0;
      do {
        iVar4 = iVar3;
        if (psVar2 != (sel_t *)0x0) {
          iVar4 = (idx_t)psVar2[iVar3];
        }
        **(long **)(local_60.data + iVar4 * 8) = **(long **)(local_60.data + iVar4 * 8) + 1;
        iVar3 = iVar3 + 1;
      } while (count != iVar3);
    }
    if (local_60.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void NullaryScatter(Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			OP::template ConstantOperation<STATE_TYPE, OP>(**sdata, aggr_input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			NullaryFlatLoop<STATE_TYPE, OP>(sdata, aggr_input_data, count);
#endif
		} else {
			UnifiedVectorFormat sdata;
			states.ToUnifiedFormat(count, sdata);
			NullaryScatterLoop<STATE_TYPE, OP>((STATE_TYPE **)sdata.data, aggr_input_data, *sdata.sel, count);
		}
	}